

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsMainTable.cpp
# Opt level: O3

QList<QRect> * __thiscall
KDReports::MainTable::pageRects(QList<QRect> *__return_storage_ptr__,MainTable *this)

{
  SpreadsheetReportLayout *pSVar1;
  Data *pDVar2;
  
  (**(code **)(*(long *)&((this->d)._M_t.
                          super___uniq_ptr_impl<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_KDReports::MainTablePrivate_*,_std::default_delete<KDReports::MainTablePrivate>_>
                          .super__Head_base<0UL,_KDReports::MainTablePrivate_*,_false>._M_head_impl)
                         ->m_layout->super_AbstractReportLayout + 0x68))();
  pSVar1 = ((this->d)._M_t.
            super___uniq_ptr_impl<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
            ._M_t.
            super__Tuple_impl<0UL,_KDReports::MainTablePrivate_*,_std::default_delete<KDReports::MainTablePrivate>_>
            .super__Head_base<0UL,_KDReports::MainTablePrivate_*,_false>._M_head_impl)->m_layout;
  pDVar2 = (pSVar1->m_pageRects).d.d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = *(QRect **)((long)&pSVar1->m_pageRects + 8);
  (__return_storage_ptr__->d).size = *(qsizetype *)((long)&pSVar1->m_pageRects + 0x10);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> KDReports::MainTable::pageRects() const
{
    d->m_layout->ensureLayouted();
    return d->m_layout->m_pageRects;
}